

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

uint32_t __thiscall
CompiledProjectOperator::evaluateExpr_
          (CompiledProjectOperator *this,DbVector **res,BatchResult *input)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  int32_t *piVar3;
  int32_t *piVar4;
  int32_t *piVar5;
  mapped_type *ppDVar6;
  DbVector *pDVar7;
  int32_t *piVar8;
  ulong uVar9;
  key_type local_50;
  
  uVar2 = **(uint **)((input->data)._M_t._M_impl.super__Rb_tree_header._M_header._M_left + 2);
  paVar1 = &local_50.field_2;
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"extprice","");
  ppDVar6 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DbVector_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DbVector_*>_>_>
            ::operator[](&input->data,&local_50);
  piVar3 = (*ppDVar6)->col;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != paVar1) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"discount","");
  ppDVar6 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DbVector_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DbVector_*>_>_>
            ::operator[](&input->data,&local_50);
  piVar4 = (*ppDVar6)->col;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"tax","");
  ppDVar6 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DbVector_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_DbVector_*>_>_>
            ::operator[](&input->data,&local_50);
  piVar5 = (*ppDVar6)->col;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  pDVar7 = (DbVector *)operator_new(0x10);
  pDVar7->n = uVar2;
  piVar8 = (int32_t *)operator_new__((ulong)uVar2 * 4);
  pDVar7->col = piVar8;
  *res = pDVar7;
  if (uVar2 != 0) {
    uVar9 = 0;
    do {
      piVar8[uVar9] = (piVar5[uVar9] + 1) * (1 - piVar4[uVar9]) * piVar3[uVar9];
      uVar9 = uVar9 + 1;
    } while (uVar2 != uVar9);
  }
  return uVar2;
}

Assistant:

uint32_t evaluateExpr_(DbVector** res, BatchResult* input) {
        uint32_t n = input->getn();
        int32_t *extprice = input->getCol("extprice")->col;
        int32_t *discount = input->getCol("discount")->col;
        int32_t *tax = input->getCol("tax")->col;

        *res = new DbVector(n);
        int32_t *r = (*res)->col;

        for (uint32_t i = 0; i < n; i++) {
            r[i] = extprice[i] * (1 - discount[i]) * (1 + tax[i]);
        }

        return n;
    }